

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

BlendFunc StringToBlendFunc(string *m)

{
  bool bVar1;
  BlendFunc BVar2;
  Logger *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = std::operator==(m,"GL_ONE");
  if (bVar1) {
    BVar2 = BLEND_GL_ONE;
  }
  else {
    bVar1 = std::operator==(m,"GL_ZERO");
    if (bVar1) {
      BVar2 = BLEND_GL_ZERO;
    }
    else {
      bVar1 = std::operator==(m,"GL_SRC_ALPHA");
      if (bVar1) {
        BVar2 = BLEND_GL_SRC_ALPHA;
      }
      else {
        bVar1 = std::operator==(m,"GL_ONE_MINUS_SRC_ALPHA");
        if (bVar1) {
          BVar2 = BLEND_GL_ONE_MINUS_SRC_ALPHA;
        }
        else {
          bVar1 = std::operator==(m,"GL_ONE_MINUS_DST_COLOR");
          if (bVar1) {
            BVar2 = BLEND_GL_ONE_MINUS_DST_COLOR;
          }
          else {
            this = Assimp::DefaultLogger::get();
            std::operator+(&local_38,"Q3Shader: Unknown blend function: ",m);
            Assimp::Logger::error(this,local_38._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_38);
            BVar2 = BLEND_NONE;
          }
        }
      }
    }
  }
  return BVar2;
}

Assistant:

Q3Shader::BlendFunc StringToBlendFunc(const std::string& m)
{
    if (m == "GL_ONE") {
        return Q3Shader::BLEND_GL_ONE;
    }
    if (m == "GL_ZERO") {
        return Q3Shader::BLEND_GL_ZERO;
    }
    if (m == "GL_SRC_ALPHA") {
        return Q3Shader::BLEND_GL_SRC_ALPHA;
    }
    if (m == "GL_ONE_MINUS_SRC_ALPHA") {
        return Q3Shader::BLEND_GL_ONE_MINUS_SRC_ALPHA;
    }
    if (m == "GL_ONE_MINUS_DST_COLOR") {
        return Q3Shader::BLEND_GL_ONE_MINUS_DST_COLOR;
    }
    ASSIMP_LOG_ERROR("Q3Shader: Unknown blend function: " + m);
    return Q3Shader::BLEND_NONE;
}